

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathRunEval(xmlXPathParserContextPtr ctxt,int toBool)

{
  xmlPatternPtr comp;
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlXPathObjectPtr in_RAX;
  xmlXPathObjectPtr *ppxVar3;
  xmlXPathCompExprPtr pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  uint uVar7;
  xmlXPathObjectPtr resObj;
  xmlXPathObjectPtr local_28;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return -1;
  }
  pxVar4 = ctxt->comp;
  if (pxVar4 == (xmlXPathCompExprPtr)0x0) {
    return -1;
  }
  ctxt->context->depth = 0;
  local_28 = in_RAX;
  if (ctxt->valueTab == (xmlXPathObjectPtr *)0x0) {
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt->valueTab = ppxVar3;
    if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
      ctxt->error = 0xf;
      xmlXPathErrMemory(ctxt->context,"creating evaluation context\n");
      (*xmlFree)(ctxt);
    }
    ctxt->valueNr = 0;
    ctxt->valueMax = 10;
    ctxt->value = (xmlXPathObjectPtr)0x0;
    ctxt->valueFrame = 0;
    pxVar4 = ctxt->comp;
  }
  comp = pxVar4->stream;
  if (comp != (xmlPatternPtr)0x0) {
    if (toBool == 0) {
      local_28 = (xmlXPathObjectPtr)0x0;
      iVar2 = xmlXPathRunStreamEval(ctxt->context,comp,&local_28,0);
      if (local_28 != (xmlXPathObjectPtr)0x0 && iVar2 != -1) {
        valuePush(ctxt,local_28);
        return 0;
      }
      if (local_28 != (xmlXPathObjectPtr)0x0) {
        xmlXPathReleaseObject(ctxt->context,local_28);
      }
      pxVar4 = ctxt->comp;
      uVar7 = pxVar4->last;
      if ((int)uVar7 < 0) goto LAB_001e4303;
      goto LAB_001e42ec;
    }
    iVar2 = xmlXPathRunStreamEval(ctxt->context,comp,(xmlXPathObjectPtr *)0x0,1);
    if (iVar2 != -1) {
      return iVar2;
    }
    pxVar4 = ctxt->comp;
  }
  uVar7 = pxVar4->last;
  if ((long)(int)uVar7 < 0) {
LAB_001e4303:
    pp_Var5 = __xmlGenericError();
    p_Var1 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar6,"xmlXPathRunEval: last is less than zero\n");
    return -1;
  }
  if (toBool != 0) {
    iVar2 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar4->steps + (int)uVar7,0);
    return iVar2;
  }
LAB_001e42ec:
  xmlXPathCompOpEval(ctxt,pxVar4->steps + uVar7);
  return 0;
}

Assistant:

static int
xmlXPathRunEval(xmlXPathParserContextPtr ctxt, int toBool)
{
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (ctxt->comp == NULL))
	return(-1);

    ctxt->context->depth = 0;

    if (ctxt->valueTab == NULL) {
	/* Allocate the value stack */
	ctxt->valueTab = (xmlXPathObjectPtr *)
			 xmlMalloc(10 * sizeof(xmlXPathObjectPtr));
	if (ctxt->valueTab == NULL) {
	    xmlXPathPErrMemory(ctxt, "creating evaluation context\n");
	    xmlFree(ctxt);
	}
	ctxt->valueNr = 0;
	ctxt->valueMax = 10;
	ctxt->value = NULL;
        ctxt->valueFrame = 0;
    }
#ifdef XPATH_STREAMING
    if (ctxt->comp->stream) {
	int res;

	if (toBool) {
	    /*
	    * Evaluation to boolean result.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, NULL, 1);
	    if (res != -1)
		return(res);
	} else {
	    xmlXPathObjectPtr resObj = NULL;

	    /*
	    * Evaluation to a sequence.
	    */
	    res = xmlXPathRunStreamEval(ctxt->context,
		ctxt->comp->stream, &resObj, 0);

	    if ((res != -1) && (resObj != NULL)) {
		valuePush(ctxt, resObj);
		return(0);
	    }
	    if (resObj != NULL)
		xmlXPathReleaseObject(ctxt->context, resObj);
	}
	/*
	* QUESTION TODO: This falls back to normal XPath evaluation
	* if res == -1. Is this intended?
	*/
    }
#endif
    comp = ctxt->comp;
    if (comp->last < 0) {
	xmlGenericError(xmlGenericErrorContext,
	    "xmlXPathRunEval: last is less than zero\n");
	return(-1);
    }
    if (toBool)
	return(xmlXPathCompOpEvalToBoolean(ctxt,
	    &comp->steps[comp->last], 0));
    else
	xmlXPathCompOpEval(ctxt, &comp->steps[comp->last]);

    return(0);
}